

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void __thiscall vm::VM::DUP2(VM *this)

{
  int *piVar1;
  
  ensureStackUsed(this,2);
  ensureStackRest(this,2);
  piVar1 = (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  piVar1[this->_sp] = piVar1[(long)this->_sp + -2];
  piVar1[(long)this->_sp + 1] = piVar1[(long)this->_sp + -1];
  this->_sp = this->_sp + 2;
  return;
}

Assistant:

void VM::DUP2() {
    ensureStackUsed(2);
    ensureStackRest(2);
    _stack[_sp] = _stack[_sp-2];
    _stack[_sp+1] = _stack[_sp-1];
    _sp += 2;
}